

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O0

vector<particle,_std::allocator<particle>_> * __thiscall symul::moveParticles(symul *this)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  reference this_00;
  floatingType *pfVar7;
  reference ppVar8;
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *this_01;
  vector<particle,_std::allocator<particle>_> *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  pair<vec2<float>,_int> pVar9;
  particle *p_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<particle,_std::allocator<particle>_> *__range1_3;
  particle *i_5;
  iterator __end1_2;
  iterator __begin1_2;
  vector<particle,_std::allocator<particle>_> *__range1_2;
  pair<int,_int> *i_4;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bcoll;
  int i_3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> collisions;
  int i_2;
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  futures;
  type getCollisions;
  pair<vec2<float>,_int> p;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int other;
  float myend;
  int b;
  int mybucket;
  int i_1;
  vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  *__range1;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  splited;
  int buckLen;
  int thrn;
  reference in_stack_fffffffffffffd78;
  vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
  *in_stack_fffffffffffffd80;
  particle *__lhs;
  value_type *in_stack_fffffffffffffd88;
  particle *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  particle *other_00;
  particle *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdc8 [16];
  const_iterator in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  type *in_stack_fffffffffffffdf0;
  vec2f *in_stack_fffffffffffffdf8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffffe30;
  __normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffe40;
  __normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_> local_1a8 [2];
  reference local_198;
  pair<int,_int> *local_190;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_188;
  particle *local_180;
  pair<int,_int> *local_178;
  pair<int,_int> *local_170;
  pair<int,_int> *local_168;
  pair<int,_int> *local_160;
  pair<int,_int> *local_158;
  pair<int,_int> *local_150;
  value_type local_140 [2];
  int local_124;
  particle local_120 [2];
  int local_f8;
  undefined1 local_f1 [33];
  int *local_d0;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  *local_c8;
  vec2<float> local_c0;
  int local_b8;
  pair<vec2<float>,_int> *local_b0;
  __normal_iterator<std::pair<vec2<float>,_int>_*,_std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
  local_a8;
  reference local_a0;
  int local_94;
  float local_90;
  int local_8c;
  vec2<float> local_88;
  int local_80;
  vec2<float> local_78;
  int local_70;
  int local_68;
  int local_64;
  reference local_60;
  vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *local_58;
  __normal_iterator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_*,_std::vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>_>
  local_50;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  *local_48;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  local_28;
  int local_10;
  int local_c [3];
  
  local_c[0] = 0xf;
  sVar4 = std::vector<particle,_std::allocator<particle>_>::size(in_RDI);
  local_10 = (int)(sVar4 / (ulong)(long)local_c[0]);
  std::
  allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
  ::allocator((allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
               *)0x119848);
  std::
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  ::vector(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
           (allocator_type *)in_stack_fffffffffffffd90);
  std::
  allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
  ::~allocator((allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
                *)0x119874);
  local_48 = &local_28;
  local_50._M_current =
       (vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *)
       std::
       vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
       ::begin((vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                *)in_stack_fffffffffffffd78);
  local_58 = (vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *)
             std::
             vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
             ::end((vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                    *)in_stack_fffffffffffffd78);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_*,_std::vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_*,_std::vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>_>
                             *)in_stack_fffffffffffffd78), bVar3) {
    local_60 = __gnu_cxx::
               __normal_iterator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_*,_std::vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>_>
               ::operator*(&local_50);
    std::vector<particle,_std::allocator<particle>_>::size(in_RDI);
    std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::reserve
              ((vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *
               )in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    __gnu_cxx::
    __normal_iterator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_*,_std::vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>_>
    ::operator++(&local_50);
  }
  for (local_64 = 0; uVar5 = (ulong)local_64,
      sVar4 = std::vector<particle,_std::allocator<particle>_>::size(in_RDI), uVar5 < sVar4;
      local_64 = local_64 + 1) {
    pvVar6 = std::vector<particle,_std::allocator<particle>_>::operator[](in_RDI,(long)local_64);
    in_stack_fffffffffffffdf8 = particle::getPosition(pvVar6);
    in_stack_fffffffffffffdf0 = (type *)vec2<float>::getY(in_stack_fffffffffffffdf8);
    dVar2 = std::floor((double)(ulong)(uint)(*(float *)&in_stack_fffffffffffffdf0->this /
                                            (float)local_10));
    in_stack_fffffffffffffdec = SUB84(dVar2,0);
    local_68 = (int)in_stack_fffffffffffffdec;
    if (local_c[0] <= local_68) {
      local_68 = local_c[0] + -1;
    }
    in_stack_fffffffffffffdd8._M_current =
         (pair<int,_int> *)
         std::
         vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
         ::operator[](&local_28,(long)local_68);
    pvVar6 = std::vector<particle,_std::allocator<particle>_>::operator[](in_RDI,(long)local_64);
    particle::getPosition(pvVar6);
    pVar9 = std::make_pair<vec2<float>const&,int&>
                      (&in_stack_fffffffffffffd90->position,(int *)in_stack_fffffffffffffd88);
    in_stack_fffffffffffffdc4 = pVar9.second;
    local_88 = pVar9.first;
    in_stack_fffffffffffffdc8._8_4_ = extraout_XMM0_Dc;
    in_stack_fffffffffffffdc8._0_4_ = local_88.x;
    in_stack_fffffffffffffdc8._4_4_ = local_88.y;
    in_stack_fffffffffffffdc8._12_4_ = extraout_XMM0_Dd;
    local_80 = in_stack_fffffffffffffdc4;
    local_78 = local_88;
    local_70 = in_stack_fffffffffffffdc4;
    std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::
    push_back(in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
  }
  local_8c = 0;
  do {
    if (local_c[0] <= local_8c) {
      local_d0 = local_c;
      local_c8 = &local_28;
      this_01 = (vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                 *)(long)local_c[0];
      other_00 = (particle *)local_f1;
      std::
      allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::allocator((allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   *)0x119d01);
      std::
      vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::vector(this_01,in_stack_fffffffffffffd98,(allocator_type *)in_stack_fffffffffffffd90);
      std::
      allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~allocator((allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)0x119d27);
      for (local_f8 = 0; local_f8 < local_c[0]; local_f8 = local_f8 + 1) {
        std::async<symul::moveParticles()::__0&,int&>
                  ((launch)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0,
                   (int *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        std::
        vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ::operator[]((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)(local_f1 + 1),(long)local_f8);
        std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
        operator=((future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   *)in_stack_fffffffffffffd90,
                  (future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   *)in_stack_fffffffffffffd88);
        std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
        ~future((future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *)
                0x119d9c);
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x119dfb);
      for (local_124 = 0; local_124 < local_c[0]; local_124 = local_124 + 1) {
        std::
        vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ::operator[]((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)(local_f1 + 1),(long)local_124);
        std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::get
                  ((future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)other_00);
        in_stack_fffffffffffffd90 = local_120;
        local_150 = (pair<int,_int> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_fffffffffffffd78);
        __gnu_cxx::
        __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
        ::__normal_iterator<std::pair<int,int>*>
                  ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)in_stack_fffffffffffffd80,
                   (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffd88 = local_140;
        local_158 = (pair<int,_int> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_fffffffffffffd78);
        local_160 = (pair<int,_int> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_fffffffffffffd78);
        local_168 = (pair<int,_int> *)
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,void>
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdc8._8_8_,
                               in_stack_fffffffffffffdc8._0_8_);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_fffffffffffffd90);
      }
      __lhs = local_120;
      local_170 = (pair<int,_int> *)
                  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             in_stack_fffffffffffffd78);
      local_178 = (pair<int,_int> *)
                  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             in_stack_fffffffffffffd78);
      std::
      shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                (in_stack_fffffffffffffe40,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )in_stack_fffffffffffffe38._M_current,in_stack_fffffffffffffe30);
      local_180 = local_120;
      local_188._M_current =
           (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_fffffffffffffd78);
      local_190 = (pair<int,_int> *)
                  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             in_stack_fffffffffffffd78);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                 *)__lhs,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                          *)in_stack_fffffffffffffd78), bVar3) {
        local_198 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator*(&local_188);
        in_stack_fffffffffffffd78 =
             std::vector<particle,_std::allocator<particle>_>::operator[]
                       (in_RDI,(long)local_198->first);
        std::vector<particle,_std::allocator<particle>_>::operator[](in_RDI,(long)local_198->second)
        ;
        particle::collideWith(in_stack_fffffffffffffdb0,other_00);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&local_188);
      }
      local_1a8[0]._M_current =
           (particle *)
           std::vector<particle,_std::allocator<particle>_>::begin
                     ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffd78);
      std::vector<particle,_std::allocator<particle>_>::end
                ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffd78);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                                 *)__lhs,(__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                                          *)in_stack_fffffffffffffd78), bVar3) {
        __gnu_cxx::__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
        ::operator*(local_1a8);
        particle::collideBox(in_stack_fffffffffffffdb0,&other_00->position,(float *)this_01);
        __gnu_cxx::__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
        ::operator++(local_1a8);
      }
      std::vector<particle,_std::allocator<particle>_>::begin
                ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffd78);
      std::vector<particle,_std::allocator<particle>_>::end
                ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffd78);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                                 *)__lhs,(__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                                          *)in_stack_fffffffffffffd78), bVar3) {
        __gnu_cxx::__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
        ::operator*((__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                     *)&stack0xfffffffffffffe38);
        particle::update(in_stack_fffffffffffffd90,(float)((ulong)in_stack_fffffffffffffd88 >> 0x20)
                        );
        __gnu_cxx::__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
        ::operator++((__normal_iterator<particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                      *)&stack0xfffffffffffffe38);
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffd90);
      std::
      vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~vector((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                 *)in_stack_fffffffffffffd90);
      std::
      vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
      ::~vector((vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                 *)in_stack_fffffffffffffd90);
      return in_RDI;
    }
    std::
    vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
    ::operator[](&local_28,(long)local_8c);
    this_00 = std::
              vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::
              back(in_stack_fffffffffffffd80);
    pfVar7 = vec2<float>::getY(&this_00->first);
    fVar1 = *(float *)&in_RDI[0xd1].super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
    local_90 = fVar1 + fVar1 + *pfVar7;
    local_94 = local_8c;
LAB_00119b83:
    local_94 = local_94 + 1;
    if (local_94 < local_c[0]) {
      local_a0 = std::
                 vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                 ::operator[](&local_28,(long)local_94);
      local_a8._M_current =
           (pair<vec2<float>,_int> *)
           std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::
           begin((vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                  *)in_stack_fffffffffffffd78);
      local_b0 = (pair<vec2<float>,_int> *)
                 std::
                 vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                 ::end((vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                        *)in_stack_fffffffffffffd78);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<vec2<float>,_int>_*,_std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
                                 *)in_stack_fffffffffffffd80,
                                (__normal_iterator<std::pair<vec2<float>,_int>_*,_std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
                                 *)in_stack_fffffffffffffd78), bVar3) {
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<vec2<float>,_int>_*,_std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
                 ::operator*(&local_a8);
        local_b8 = ppVar8->second;
        local_c0 = ppVar8->first;
        in_stack_fffffffffffffdb0 = (particle *)vec2<float>::getY(&local_c0);
        if (local_90 <
            *(float *)&(((_Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                          *)&in_stack_fffffffffffffdb0->position)->_M_impl).super__Vector_impl_data.
                       _M_start) break;
        std::
        vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
        ::operator[](&local_28,(long)local_8c);
        std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::
        push_back((vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                   *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        __gnu_cxx::
        __normal_iterator<std::pair<vec2<float>,_int>_*,_std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>
        ::operator++(&local_a8);
      }
      goto LAB_00119b83;
    }
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

const std::vector<particle>& symul::moveParticles()
{
    using posind = std::vector<std::pair<vec2f, int>>; 

    // number of threads == number of buckets
    int thrn = 15;

    // put positions in thrn buckets by their Y
    int buckLen = particles.size() / thrn;
    std::vector<posind> splited(thrn);
    for(auto& i : splited)
        i.reserve(particles.size() * 2 / thrn);
    for(int i = 0; i < particles.size(); i++)
    {
        int mybucket = static_cast<int>(std::floor(particles[i].getPosition().getY() / buckLen));
        if(mybucket >= thrn)
            mybucket = thrn - 1;
        splited[mybucket].push_back(std::make_pair(particles[i].getPosition(), i));
    }
    // put particles close to bucket edge in multiple buckets
    for(int b = 0; b < thrn; b++)
    {
        float myend = splited[b].back().first.getY() + particleR * 2;
        for(int other = b + 1; other < thrn; other++)
        {
            for(auto p : splited[other])
            {
                if(p.first.getY() > myend)
                    break;
                splited[b].push_back(p);
            }
        }
    }

    // function that returns collisions from one bucket
    auto getCollisions = [&](int b)
    {
        std::vector<std::pair<int, int>> myCollisions;    
        myCollisions.reserve(particles.size() * 2 / thrn);

        std::sort(splited[b].begin(), splited[b].end(), [](auto x, auto y)
        { 
            return x.first.getX() < y.first.getX();
        });

        auto startj = splited[b].begin();
        for(auto i = splited[b].begin(); i < splited[b].end(); i++)
        {
            while(startj < i && startj->first.getX() < i->first.getX() - particleR * 2)
                startj++;
            for(auto j = startj; j < i; j++)
            {
                if((j->first - i->first).getLength() < 2 * particleR)
                    myCollisions.push_back(std::make_pair(i->second, j->second));
            }
        }
        return myCollisions;
    };

    // get collisions
    std::vector<std::future<std::vector<std::pair<int, int>>>> futures(thrn);
    for(int i = 0; i < thrn; i++)
    {
        futures[i] = std::async(std::launch::async, getCollisions, i);
    }

    // get collisions in one vector
    std::vector<std::pair<int, int>> collisions;
    for(int i = 0; i < thrn; i++)
    {
        auto bcoll = futures[i].get();
        collisions.insert(collisions.end(), bcoll.begin(), bcoll.end());
    }

    // shuffle collisions
    std::shuffle(collisions.begin(), collisions.end(), mt_rand);

    // apply collisions
    for(auto& i : collisions)
        particles[i.first].collideWith(particles[i.second]);
    
    // collide with box
    for(auto& i : particles)
        i.collideBox(box, particleR);

    // update position
    for(auto& p : particles)
        p.update(timeTick);

    //std::cerr << "collisions: " << collisions.size() << std::endl;

    return particles;
}